

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

bool __thiscall cppcms::form::iterator::equal(iterator *this,iterator *other)

{
  bool bVar1;
  
  if ((this->current_ == other->current_) && (this->offset_ == other->offset_)) {
    bVar1 = std::operator==((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                            (deque<unsigned_int,_std::allocator<unsigned_int>_> *)other);
    return bVar1;
  }
  return false;
}

Assistant:

bool form::iterator::equal(form::iterator const &other) const
{
	return 	current_ == other.current_ 
		&& offset_ == other.offset_
		&& return_positions_ == other.return_positions_;
}